

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

void __thiscall
kj::Maybe<capnp::MessageReaderAndFds>::Maybe
          (Maybe<capnp::MessageReaderAndFds> *this,Maybe<capnp::MessageReaderAndFds> *other)

{
  MessageReader *pMVar1;
  Disposer *pDVar2;
  size_t sVar3;
  byte bVar4;
  
  bVar4 = (other->ptr).isSet;
  (this->ptr).isSet = (bool)bVar4;
  if ((bool)bVar4 == true) {
    pMVar1 = (other->ptr).field_1.value.reader.ptr;
    (this->ptr).field_1.value.reader.disposer = (other->ptr).field_1.value.reader.disposer;
    (this->ptr).field_1.value.reader.ptr = pMVar1;
    (other->ptr).field_1.value.reader.ptr = (MessageReader *)0x0;
    sVar3 = (other->ptr).field_1.value.fds.size_;
    (this->ptr).field_1.value.fds.ptr = (other->ptr).field_1.value.fds.ptr;
    (this->ptr).field_1.value.fds.size_ = sVar3;
    bVar4 = (other->ptr).isSet;
  }
  if ((bVar4 & 1) != 0) {
    (other->ptr).isSet = false;
    pMVar1 = (other->ptr).field_1.value.reader.ptr;
    if (pMVar1 != (MessageReader *)0x0) {
      (other->ptr).field_1.value.reader.ptr = (MessageReader *)0x0;
      pDVar2 = (other->ptr).field_1.value.reader.disposer;
      (**pDVar2->_vptr_Disposer)
                (pDVar2,(code *)((long)pMVar1->arenaSpace +
                                (long)(pMVar1->_vptr_MessageReader[-2] + -0x18)));
    }
  }
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }